

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

void attr_counter_free(attr_counter **top)

{
  attr_counter *paVar1;
  attr_counter *__ptr;
  
  __ptr = *top;
  if (*top != (attr_counter *)0x0) {
    while (__ptr != (attr_counter *)0x0) {
      paVar1 = __ptr->next;
      free(__ptr);
      __ptr = paVar1;
    }
    *top = (attr_counter *)0x0;
  }
  return;
}

Assistant:

static void
attr_counter_free(struct attr_counter **top)
{
	struct attr_counter *ac, *tac;

	if (*top == NULL)
		return;
	ac = *top;
        while (ac != NULL) {
		tac = ac->next;
		free(ac);
		ac = tac;
	}
	*top = NULL;
}